

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddWatchOnlyWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CScript *dest)

{
  long lVar1;
  WalletStorage *pWVar2;
  bool bVar3;
  mapped_type *keyMeta;
  long lVar4;
  long args_1;
  long in_FS_OFFSET;
  CScriptID local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  LegacyDataSPKM::AddWatchOnlyInMem(&this->super_LegacyDataSPKM,dest);
  CScriptID::CScriptID(&local_4c,dest);
  keyMeta = std::
            map<CScriptID,_wallet::CKeyMetadata,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_wallet::CKeyMetadata>_>_>
            ::operator[](&(this->super_LegacyDataSPKM).m_script_metadata,&local_4c);
  lVar1 = keyMeta->nCreateTime;
  lVar4 = 1;
  if ((lVar1 < 2) ||
     (args_1 = this->nTimeFirstKey, lVar4 = lVar1, args_1 == 0x7fffffffffffffff || lVar1 < args_1))
  {
    this->nTimeFirstKey = lVar4;
    args_1 = lVar4;
  }
  boost::signals2::
  signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
  ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyFirstKeyTimeChanged,
               (ScriptPubKeyMan *)this,args_1);
  boost::signals2::
  signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
  ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyWatchonlyChanged,true);
  bVar3 = WalletBatch::WriteWatchOnly(batch,dest,keyMeta);
  if (bVar3) {
    pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    (*pWVar2->_vptr_WalletStorage[5])(pWVar2,batch);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddWatchOnlyWithDB(WalletBatch &batch, const CScript& dest)
{
    if (!AddWatchOnlyInMem(dest))
        return false;
    const CKeyMetadata& meta = m_script_metadata[CScriptID(dest)];
    UpdateTimeFirstKey(meta.nCreateTime);
    NotifyWatchonlyChanged(true);
    if (batch.WriteWatchOnly(dest, meta)) {
        m_storage.UnsetBlankWalletFlag(batch);
        return true;
    }
    return false;
}